

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(uint lhs,SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_RSI;
  uint in_EDI;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
  in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_8);
  bVar1 = ModulusSimpleCaseHelper<unsigned_long,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(in_EDI,in_RSI,&local_8);
  if (!bVar1) {
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffd8,(uint *)&stack0xffffffffffffffec);
    SafeInt::operator_cast_to_unsigned_long
              ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_RSI.m_int);
    SVar2 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),in_RSI.m_int);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_RSI.m_int,
               (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(SVar2.m_int,in_stack_ffffffffffffffd8.m_int));
  }
  return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8.m_int
  ;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}